

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

bool __thiscall
Lib::
FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
::hasNext(FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
          *this)

{
  AnyNumber<Kernel::MonomFactor> *pAVar1;
  _ElementType next;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_94;
  OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> local_74;
  AnyNumber<Kernel::MonomFactor> local_50;
  
  if ((this->_next).super_OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>._isSome == false)
  {
    do {
      pAVar1 = (this->_inn)._inner._pointer;
      if (pAVar1 == ((this->_inn)._inner._stack)->_stack) {
        return false;
      }
      pAVar1 = pAVar1 + -1;
      (this->_inn)._inner._pointer = pAVar1;
      CoproductImpl::TrivialOperations::CopyCons::
      DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
      ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     *)&local_74,
                    (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                     *)pAVar1);
      CoproductImpl::TrivialOperations::MoveCons::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ::DefaultImpl(&local_94,
                    (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     *)&local_74);
      if ((local_94.
           super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
           ._0_1_ & 3) == 1) {
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryVar
                  ((MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_74);
      }
      else if ((local_94.
                super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                ._0_1_ & 3) == 0) {
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>::tryVar
                  ((MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)&local_74);
      }
      else {
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>::tryVar
                  ((MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_74);
      }
    } while (local_74._isSome != true);
    CoproductImpl::TrivialOperations::MoveCons::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                   *)&local_50,&local_94);
    OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::OptionBase(&local_74,&local_50);
    OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator=
              (&(this->_next).super_OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>,
               &local_74);
  }
  return true;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }